

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_1::BinaryWriterSpec::WriteAction(BinaryWriterSpec *this,Action *action)

{
  string_view sVar1;
  bool bVar2;
  ActionType AVar3;
  InvokeAction *pIVar4;
  Action *action_local;
  BinaryWriterSpec *this_local;
  
  WriteKey(this,"action");
  Stream::Writef(this->json_stream_,"{");
  WriteKey(this,"type");
  AVar3 = Action::type(action);
  if (AVar3 == Invoke) {
    WriteString(this,"invoke");
  }
  else {
    AVar3 = Action::type(action);
    if (AVar3 != Get) {
      __assert_fail("action.type() == ActionType::Get",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/binary-writer-spec.cc"
                    ,0x151,
                    "void wabt::(anonymous namespace)::BinaryWriterSpec::WriteAction(const Action &)"
                   );
    }
    WriteString(this,"get");
  }
  WriteSeparator(this);
  bVar2 = Var::is_name(&action->module_var);
  if (bVar2) {
    WriteKey(this,"module");
    WriteVar(this,&action->module_var);
    WriteSeparator(this);
  }
  AVar3 = Action::type(action);
  if (AVar3 == Invoke) {
    WriteKey(this,"field");
    sVar1 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)&action->name);
    WriteEscapedString(this,sVar1);
    WriteSeparator(this);
    WriteKey(this,"args");
    pIVar4 = cast<wabt::InvokeAction,wabt::Action>(action);
    WriteConstVector(this,&pIVar4->args);
  }
  else {
    WriteKey(this,"field");
    sVar1 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)&action->name);
    WriteEscapedString(this,sVar1);
  }
  Stream::Writef(this->json_stream_,"}");
  return;
}

Assistant:

void BinaryWriterSpec::WriteAction(const Action& action) {
  WriteKey("action");
  json_stream_->Writef("{");
  WriteKey("type");
  if (action.type() == ActionType::Invoke) {
    WriteString("invoke");
  } else {
    assert(action.type() == ActionType::Get);
    WriteString("get");
  }
  WriteSeparator();
  if (action.module_var.is_name()) {
    WriteKey("module");
    WriteVar(action.module_var);
    WriteSeparator();
  }
  if (action.type() == ActionType::Invoke) {
    WriteKey("field");
    WriteEscapedString(action.name);
    WriteSeparator();
    WriteKey("args");
    WriteConstVector(cast<InvokeAction>(&action)->args);
  } else {
    WriteKey("field");
    WriteEscapedString(action.name);
  }
  json_stream_->Writef("}");
}